

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O2

bool __thiscall r_exec::PGMOverlay::is_invalidated(PGMOverlay *this)

{
  pointer pPVar1;
  char cVar2;
  pointer pPVar3;
  bool bVar4;
  P<r_code::View> input_view;
  
  if (this->is_volatile == true) {
    pPVar3 = (this->input_views).
             super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (this->input_views).
             super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pPVar3 == pPVar1) goto LAB_001a635f;
      input_view.object = pPVar3->object;
      LOCK();
      ((input_view.object)->refCount).super___atomic_base<long>._M_i =
           ((input_view.object)->refCount).super___atomic_base<long>._M_i + 1;
      UNLOCK();
      cVar2 = (**(code **)(*input_view.object[2]._vptr__Object + 0x70))();
      if (cVar2 != '\0') {
        LOCK();
        (this->super_InputLessPGMOverlay).super_Overlay.invalidated.
        super___atomic_base<unsigned_long>._M_i = 1;
        UNLOCK();
      }
      core::P<r_code::View>::~P(&input_view);
      pPVar3 = pPVar3 + 1;
    } while (cVar2 == '\0');
    bVar4 = true;
  }
  else {
LAB_001a635f:
    bVar4 = (this->super_InputLessPGMOverlay).super_Overlay.invalidated.
            super___atomic_base<unsigned_long>._M_i == 1;
  }
  return bVar4;
}

Assistant:

bool PGMOverlay::is_invalidated()
{
    if (is_volatile) {
        for (P<r_code::View> input_view : input_views) {
            if (input_view->object->is_invalidated()) {
                return (invalidated = 1);
            }
        }
    }

    return invalidated == 1;
}